

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O1

void __thiscall wasm::DAE::~DAE(DAE *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__DAE_00d87fd8;
  std::
  _Hashtable<wasm::Call_*,_std::pair<wasm::Call_*const,_wasm::Expression_**>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Call_*>,_std::hash<wasm::Call_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->allDroppedCalls)._M_h);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_00d87048;
  pcVar2 = (this->super_Pass).name._M_dataplus._M_p;
  paVar1 = &(this->super_Pass).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x70);
  return;
}

Assistant:

bool invalidatesDWARF() override { return true; }